

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

Shape tabwidgetPositionToTabBarShape(QWidget *w)

{
  Shape SVar1;
  long lVar2;
  QWidgetPrivate *pQVar3;
  
  lVar2 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
  if (lVar2 == 0) {
    SVar1 = RoundedSouth;
  }
  else {
    pQVar3 = qt_widget_private(w);
    SVar1 = RoundedSouth;
    if (*(Shape *)&pQVar3->field_0x254 < TriangularNorth) {
      SVar1 = *(Shape *)&pQVar3->field_0x254;
    }
  }
  return SVar1;
}

Assistant:

static QTabBar::Shape tabwidgetPositionToTabBarShape(QWidget *w)
{
    QTabBar::Shape result = QTabBar::RoundedSouth;
    if (qobject_cast<QDockWidget *>(w)) {
        switch (static_cast<QDockWidgetPrivate *>(qt_widget_private(w))->tabPosition) {
        case QTabWidget::North:
            result = QTabBar::RoundedNorth;
            break;
        case QTabWidget::South:
            result = QTabBar::RoundedSouth;
            break;
        case QTabWidget::West:
            result = QTabBar::RoundedWest;
            break;
        case QTabWidget::East:
            result = QTabBar::RoundedEast;
            break;
        }
    }
    return result;
}